

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.cpp
# Opt level: O3

void __thiscall
yactfr::internal::BeginReadOptBoolSelInstr::BeginReadOptBoolSelInstr
          (BeginReadOptBoolSelInstr *this,StructureMemberType *memberType,DataType *dt)

{
  Shared *pSVar1;
  
  (this->super_BeginReadOptInstr).super_BeginReadCompoundInstr.super_ReadDataInstr.super_Instr.
  _theKind = BeginReadOptBoolSel;
  (this->super_BeginReadOptInstr).super_BeginReadCompoundInstr.super_ReadDataInstr._memberType =
       memberType;
  (this->super_BeginReadOptInstr).super_BeginReadCompoundInstr.super_ReadDataInstr._dt = dt;
  (this->super_BeginReadOptInstr).super_BeginReadCompoundInstr.super_ReadDataInstr._align =
       dt->_align;
  (this->super_BeginReadOptInstr).super_BeginReadCompoundInstr._proc._rawProc.
  super__Vector_base<const_yactfr::internal::Instr_*,_std::allocator<const_yactfr::internal::Instr_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_BeginReadOptInstr).super_BeginReadCompoundInstr._proc._rawProc.
           super__Vector_base<const_yactfr::internal::Instr_*,_std::allocator<const_yactfr::internal::Instr_*>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_BeginReadOptInstr).super_BeginReadCompoundInstr._proc._rawProc.
           super__Vector_base<const_yactfr::internal::Instr_*,_std::allocator<const_yactfr::internal::Instr_*>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  pSVar1 = &(this->super_BeginReadOptInstr).super_BeginReadCompoundInstr._proc._sharedProc;
  *(Shared **)
   ((long)&(this->super_BeginReadOptInstr).super_BeginReadCompoundInstr._proc._sharedProc.
           super__List_base<std::shared_ptr<yactfr::internal::Instr>,_std::allocator<std::shared_ptr<yactfr::internal::Instr>_>_>
           ._M_impl._M_node + 8) = pSVar1;
  (this->super_BeginReadOptInstr).super_BeginReadCompoundInstr._proc._sharedProc.
  super__List_base<std::shared_ptr<yactfr::internal::Instr>,_std::allocator<std::shared_ptr<yactfr::internal::Instr>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pSVar1;
  *(size_t *)
   ((long)&(this->super_BeginReadOptInstr).super_BeginReadCompoundInstr._proc._sharedProc.
           super__List_base<std::shared_ptr<yactfr::internal::Instr>,_std::allocator<std::shared_ptr<yactfr::internal::Instr>_>_>
           ._M_impl._M_node + 0x10) = 0;
  (this->super_BeginReadOptInstr)._selPos = 0xffffffffffffffff;
  (this->super_BeginReadOptInstr).super_BeginReadCompoundInstr.super_ReadDataInstr.super_Instr.
  _vptr_Instr = (_func_int **)&PTR__BeginReadCompoundInstr_003001e8;
  return;
}

Assistant:

Instr::Instr(const Kind kind) noexcept :
    _theKind {kind}
{
}